

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-util.c
# Opt level: O3

void utf8_clipto(char *s,size_t n)

{
  long lVar1;
  long lVar2;
  size_t sVar3;
  bool bVar4;
  
  if (n != 0) {
    if (*s == '\0') {
      lVar2 = 0;
    }
    else {
      bVar4 = false;
      sVar3 = 0;
      lVar2 = 0;
      do {
        if (bVar4) break;
        sVar3 = sVar3 + 1;
        bVar4 = sVar3 == n;
        lVar1 = lVar2 + 1;
        lVar2 = lVar2 + 1;
      } while (s[lVar1] != '\0');
    }
    s = s + lVar2;
  }
  *s = '\0';
  return;
}

Assistant:

void utf8_clipto(char *s, size_t n)
{
	size_t i = 0, j = 0;
	bool terminate_next = false;

	if (n == 0) {
		s[i] = 0;
		return;
	}

	while (s[i]) {
		if ((s[i] & 0xc0) != 0x80) {
			j++;
			if (terminate_next)
				break;
			if (j == n)
				terminate_next = true;
		}
		i++;
	}
	s[i] = 0;
}